

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::SwapElements
          (ExtensionSet *this,int number,int index1,int index2)

{
  byte bVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  long lVar4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  LogMessage *pLVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  LogFinisher local_d9;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  p_Var9 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var9->_M_header;
  for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < number]) {
    if (number <= (int)p_Var8[1]._M_color) {
      p_Var6 = p_Var8;
    }
  }
  p_Var8 = &p_Var9->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var9) && (p_Var8 = p_Var6, number < (int)p_Var6[1]._M_color))
  {
    p_Var8 = &p_Var9->_M_header;
  }
  if ((_Rb_tree_header *)p_Var8 == p_Var9) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x27b);
    pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: iter != extensions_.end(): ");
    pLVar7 = LogMessage::operator<<(pLVar7,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=((LogFinisher *)&local_d8,pLVar7);
    LogMessage::~LogMessage(&local_68);
  }
  if (*(char *)((long)&p_Var8[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x27e);
    pLVar7 = LogMessage::operator<<(&local_a0,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=((LogFinisher *)&local_d8,pLVar7);
    LogMessage::~LogMessage(&local_a0);
  }
  bVar1 = *(byte *)&p_Var8[1]._M_left;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
               ,0x35);
    pLVar7 = LogMessage::operator<<
                       (&local_d8,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_d9,pLVar7);
    LogMessage::~LogMessage(&local_d8);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
  case 3:
  case 8:
    lVar4 = *(long *)p_Var8[1]._M_parent;
    uVar3 = *(undefined4 *)(lVar4 + (long)index1 * 4);
    *(undefined4 *)(lVar4 + (long)index1 * 4) = *(undefined4 *)(lVar4 + (long)index2 * 4);
    *(undefined4 *)(lVar4 + (long)index2 * 4) = uVar3;
    break;
  case 2:
  case 4:
  case 9:
  case 10:
    lVar4 = *(long *)p_Var8[1]._M_parent;
    uVar5 = *(undefined8 *)(lVar4 + (long)index1 * 8);
    *(undefined8 *)(lVar4 + (long)index1 * 8) = *(undefined8 *)(lVar4 + (long)index2 * 8);
    *(undefined8 *)(lVar4 + (long)index2 * 8) = uVar5;
    break;
  case 5:
    lVar4 = *(long *)p_Var8[1]._M_parent;
    uVar5 = *(undefined8 *)(lVar4 + (long)index1 * 8);
    *(undefined8 *)(lVar4 + (long)index1 * 8) = *(undefined8 *)(lVar4 + (long)index2 * 8);
    *(undefined8 *)(lVar4 + (long)index2 * 8) = uVar5;
    break;
  case 6:
    lVar4 = *(long *)p_Var8[1]._M_parent;
    uVar3 = *(undefined4 *)(lVar4 + (long)index1 * 4);
    *(undefined4 *)(lVar4 + (long)index1 * 4) = *(undefined4 *)(lVar4 + (long)index2 * 4);
    *(undefined4 *)(lVar4 + (long)index2 * 4) = uVar3;
    break;
  case 7:
    lVar4 = *(long *)p_Var8[1]._M_parent;
    uVar2 = *(undefined1 *)(lVar4 + index1);
    *(undefined1 *)(lVar4 + index1) = *(undefined1 *)(lVar4 + index2);
    *(undefined1 *)(lVar4 + index2) = uVar2;
  }
  return;
}

Assistant:

void ExtensionSet::SwapElements(int number, int index1, int index2) {
  map<int, Extension>::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";

  Extension* extension = &iter->second;
  GOOGLE_DCHECK(extension->is_repeated);

  switch(cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->SwapElements(index1, index2);
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->SwapElements(index1, index2);
      break;
  }
}